

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnSimdLaneOp(TypeChecker *this,Opcode opcode,uint64_t lane_idx)

{
  uint32_t uVar1;
  Result RVar2;
  Opcode local_1c [2];
  Opcode opcode_local;
  
  local_1c[0].enum_ = opcode.enum_;
  uVar1 = Opcode::GetSimdLaneCount(local_1c);
  if (uVar1 <= lane_idx) {
    PrintError(this,"lane index must be less than %d (got %lu)",(ulong)uVar1,lane_idx);
  }
  if ((0x24933U >> (local_1c[0].enum_ - I8X16ExtractLaneS & 0x1f) & 1) == 0) {
    RVar2 = CheckOpcode2(this,local_1c[0]);
  }
  else {
    RVar2 = CheckOpcode1(this,local_1c[0]);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnSimdLaneOp(Opcode opcode, uint64_t lane_idx) {
  Result result = Result::Error;
  uint32_t lane_count = opcode.GetSimdLaneCount();
  if (lane_idx >= lane_count) {
    PrintError("lane index must be less than %d (got %" PRIu64 ")", lane_count,
               lane_idx);
  }

  switch (opcode) {
    case Opcode::I8X16ExtractLaneS:
    case Opcode::I8X16ExtractLaneU:
    case Opcode::I16X8ExtractLaneS:
    case Opcode::I16X8ExtractLaneU:
    case Opcode::I32X4ExtractLane:
    case Opcode::F32X4ExtractLane:
    case Opcode::I64X2ExtractLane:
    case Opcode::F64X2ExtractLane:
      result = CheckOpcode1(opcode);
      break;
    case Opcode::I8X16ReplaceLane:
    case Opcode::I16X8ReplaceLane:
    case Opcode::I32X4ReplaceLane:
    case Opcode::F32X4ReplaceLane:
    case Opcode::I64X2ReplaceLane:
    case Opcode::F64X2ReplaceLane:
      result = CheckOpcode2(opcode);
      break;
    default:
      WABT_UNREACHABLE;
  }
  return result;
}